

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestMixedFieldsAndExtensions::_InternalSerialize
          (TestMixedFieldsAndExtensions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<unsigned_int> *this_00;
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  const_pointer data;
  LogMessageFatal local_40;
  
  if ((*(byte *)((long)&this->field_0 + 0x18) & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.a_,target);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestMixedFieldsAndExtensions_default_instance_,2,3,target,
                      stream);
  this_00 = &(this->field_0)._impl_.b_;
  iVar2 = google::protobuf::RepeatedField<unsigned_int>::size(this_00);
  if (0 < iVar2) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,puVar4);
    iVar2 = google::protobuf::RepeatedField<unsigned_int>::size(this_00);
    if (stream->end_ <= puVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    *puVar4 = '\x1a';
    puVar4 = puVar4 + 2;
    for (uVar3 = iVar2 << 2; 0x7f < uVar3; uVar3 = uVar3 >> 7) {
      puVar4[-1] = (byte)uVar3 | 0x80;
      puVar4 = puVar4 + 1;
    }
    puVar4[-1] = (byte)uVar3;
    data = google::protobuf::RepeatedField<unsigned_int>::data(this_00);
    puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRaw(stream,data,iVar2 << 2,puVar4);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_TestMixedFieldsAndExtensions_default_instance_,4,5,puVar4,
                      stream);
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return puVar4;
  }
  puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMixedFieldsAndExtensions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMixedFieldsAndExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestMixedFieldsAndExtensions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 a = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_a(), target);
  }

  // Extension range [2, 3)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 3, target, stream);
  // repeated fixed32 b = 3;
  if (this_._internal_b_size() > 0) {
    target = stream->WriteFixedPacked(3, this_._internal_b(), target);
  }

  // Extension range [4, 5)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 4, 5, target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestMixedFieldsAndExtensions)
  return target;
}